

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

Cxx20SupportLevel __thiscall
cmGeneratorTarget::HaveCxxModuleSupport(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  Cxx20SupportLevel CVar2;
  cmState *this_01;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  cmStandardLevelResolver standardResolver;
  string local_40;
  
  this_01 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CXX",(allocator<char> *)&local_40);
  bVar1 = cmState::GetLanguageEnabled(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  CVar2 = MissingCxx;
  if (bVar1) {
    standardResolver.Makefile = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CXX",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"cxx_std_20",&local_6a);
    bVar1 = cmStandardLevelResolver::HaveStandardAvailable
                      (&standardResolver,this,&local_68,config,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP",
                 (allocator<char> *)&local_40);
      bVar1 = cmMakefile::IsOn(this_00,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      CVar2 = (uint)bVar1 * 2 + MissingExperimentalFlag;
    }
    else {
      CVar2 = NoCxx20;
    }
  }
  return CVar2;
}

Assistant:

cmGeneratorTarget::Cxx20SupportLevel cmGeneratorTarget::HaveCxxModuleSupport(
  std::string const& config) const
{
  auto const* state = this->Makefile->GetState();
  if (!state->GetLanguageEnabled("CXX")) {
    return Cxx20SupportLevel::MissingCxx;
  }
  cmStandardLevelResolver standardResolver(this->Makefile);
  if (!standardResolver.HaveStandardAvailable(this, "CXX", config,
                                              "cxx_std_20")) {
    return Cxx20SupportLevel::NoCxx20;
  }
  if (!this->Makefile->IsOn("CMAKE_EXPERIMENTAL_CXX_MODULE_DYNDEP")) {
    return Cxx20SupportLevel::MissingExperimentalFlag;
  }
  return Cxx20SupportLevel::Supported;
}